

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_make_sorted_files(archive_write *a,isoent *isoent,idr *idr)

{
  idrent *idrent;
  isoent **children;
  archive_rb_node *rn;
  idr *idr_local;
  isoent *isoent_local;
  archive_write *a_local;
  
  idrent = (idrent *)malloc((long)(isoent->children).cnt << 3);
  if (idrent == (idrent *)0x0) {
    archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
    a_local._4_4_ = -0x1e;
  }
  else {
    isoent->children_sorted = (isoent **)idrent;
    children = (isoent **)__archive_rb_tree_iterate(&idr->rbtree,(archive_rb_node *)0x0,0);
    while (children != (isoent **)0x0) {
      (idrent->rbnode).rb_nodes[0] = &children[5]->rbnode;
      children = (isoent **)__archive_rb_tree_iterate(&idr->rbtree,(archive_rb_node *)children,1);
      idrent = (idrent *)((idrent->rbnode).rb_nodes + 1);
    }
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
isoent_make_sorted_files(struct archive_write *a, struct isoent *isoent,
    struct idr *idr)
{
	struct archive_rb_node *rn;
	struct isoent **children;

	children = malloc(isoent->children.cnt * sizeof(struct isoent *));
	if (children == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	isoent->children_sorted = children;

	ARCHIVE_RB_TREE_FOREACH(rn, &(idr->rbtree)) {
		struct idrent *idrent = (struct idrent *)rn;
		*children ++ = idrent->isoent;
	}
	return (ARCHIVE_OK);
}